

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int32_t GetCombineCostFactor(int histo_size,int quality)

{
  int32_t combine_cost_factor;
  int quality_local;
  int histo_size_local;
  
  combine_cost_factor = 0x10;
  if (quality < 0x5a) {
    if (0x100 < histo_size) {
      combine_cost_factor = 8;
    }
    if (0x200 < histo_size) {
      combine_cost_factor = (uint)combine_cost_factor / 2;
    }
    if (0x400 < histo_size) {
      combine_cost_factor = (uint)combine_cost_factor / 2;
    }
    if (quality < 0x33) {
      combine_cost_factor = (uint)combine_cost_factor / 2;
    }
  }
  return combine_cost_factor;
}

Assistant:

static int32_t GetCombineCostFactor(int histo_size, int quality) {
  int32_t combine_cost_factor = 16;
  if (quality < 90) {
    if (histo_size > 256) combine_cost_factor /= 2;
    if (histo_size > 512) combine_cost_factor /= 2;
    if (histo_size > 1024) combine_cost_factor /= 2;
    if (quality <= 50) combine_cost_factor /= 2;
  }
  return combine_cost_factor;
}